

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O3

void gai_iterator_reset(_iterator_hdl *hdl)

{
  short sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  global_array_t *pgVar4;
  long lVar5;
  ulong uVar6;
  int iVar9;
  undefined1 auVar7 [16];
  int iVar10;
  undefined1 auVar8 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pgVar4 = GA;
  if ((uint)GA[hdl->g_a + 1000].distr_type < 5) {
    lVar5 = hdl->g_a + 1000;
    switch(GA[hdl->g_a + 1000].distr_type) {
    case 0:
      hdl->count = 0;
      return;
    case 1:
      hdl->offset = 0;
      hdl->iproc = 0;
      hdl->iblock = 0;
      return;
    case 2:
      hdl->offset = 0;
      hdl->iproc = 0;
      sVar1 = pgVar4[lVar5].ndim;
      hdl->proc_index[0] = 0;
      auVar3 = _DAT_001b0520;
      auVar2 = _DAT_001b04f0;
      if ((long)sVar1 < 2) {
LAB_0011c12a:
        hdl->index[0] = 0;
        return;
      }
      lVar5 = (long)sVar1 + -2;
      auVar8._8_4_ = (int)lVar5;
      auVar8._0_8_ = lVar5;
      auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar6 = 0;
      auVar8 = auVar8 ^ _DAT_001b04f0;
      do {
        auVar13._8_4_ = (int)uVar6;
        auVar13._0_8_ = uVar6;
        auVar13._12_4_ = (int)(uVar6 >> 0x20);
        auVar7 = (auVar13 | auVar3) ^ auVar2;
        iVar9 = auVar8._4_4_;
        iVar10 = auVar8._12_4_;
        if ((bool)(~(auVar7._4_4_ == iVar9 && auVar8._0_4_ < auVar7._0_4_ || iVar9 < auVar7._4_4_) &
                  1)) {
          hdl->proc_index[uVar6 + 1] = 0;
        }
        if ((auVar7._12_4_ != iVar10 || auVar7._8_4_ <= auVar8._8_4_) && auVar7._12_4_ <= iVar10) {
          hdl->proc_index[uVar6 + 2] = 0;
        }
        uVar6 = uVar6 + 2;
      } while (((int)sVar1 & 0x7ffe) != uVar6);
      hdl->index[0] = 0;
      if (1 < sVar1) {
        uVar6 = 0;
        do {
          auVar14._8_4_ = (int)uVar6;
          auVar14._0_8_ = uVar6;
          auVar14._12_4_ = (int)(uVar6 >> 0x20);
          auVar7 = (auVar14 | auVar3) ^ auVar2;
          if ((bool)(~(auVar7._4_4_ == iVar9 && auVar8._0_4_ < auVar7._0_4_ || iVar9 < auVar7._4_4_)
                    & 1)) {
            hdl->index[uVar6 + 1] = 0;
          }
          if ((auVar7._12_4_ != iVar10 || auVar7._8_4_ <= auVar8._8_4_) && auVar7._12_4_ <= iVar10)
          {
            hdl->index[uVar6 + 2] = 0;
          }
          uVar6 = uVar6 + 2;
        } while (((int)sVar1 & 0x7ffe) != uVar6);
      }
      break;
    default:
      hdl->offset = 0;
      hdl->iproc = 0;
      sVar1 = pgVar4[lVar5].ndim;
      hdl->proc_index[0] = 0;
      auVar3 = _DAT_001b0520;
      auVar2 = _DAT_001b04f0;
      if ((long)sVar1 < 2) goto LAB_0011c12a;
      lVar5 = (long)sVar1 + -2;
      auVar7._8_4_ = (int)lVar5;
      auVar7._0_8_ = lVar5;
      auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar6 = 0;
      auVar7 = auVar7 ^ _DAT_001b04f0;
      do {
        auVar11._8_4_ = (int)uVar6;
        auVar11._0_8_ = uVar6;
        auVar11._12_4_ = (int)(uVar6 >> 0x20);
        auVar11 = (auVar11 | auVar3) ^ auVar2;
        iVar9 = auVar7._4_4_;
        iVar10 = auVar7._12_4_;
        if ((bool)(~(auVar11._4_4_ == iVar9 && auVar7._0_4_ < auVar11._0_4_ || iVar9 < auVar11._4_4_
                    ) & 1)) {
          hdl->proc_index[uVar6 + 1] = 0;
        }
        if ((auVar11._12_4_ != iVar10 || auVar11._8_4_ <= auVar7._8_4_) && auVar11._12_4_ <= iVar10)
        {
          hdl->proc_index[uVar6 + 2] = 0;
        }
        uVar6 = uVar6 + 2;
      } while (((int)sVar1 & 0x7ffe) != uVar6);
      hdl->index[0] = 0;
      if (1 < sVar1) {
        uVar6 = 0;
        do {
          auVar12._8_4_ = (int)uVar6;
          auVar12._0_8_ = uVar6;
          auVar12._12_4_ = (int)(uVar6 >> 0x20);
          auVar11 = (auVar12 | auVar3) ^ auVar2;
          if ((bool)(~(auVar11._4_4_ == iVar9 && auVar7._0_4_ < auVar11._0_4_ ||
                      iVar9 < auVar11._4_4_) & 1)) {
            hdl->index[uVar6 + 1] = 0;
          }
          if ((auVar11._12_4_ != iVar10 || auVar11._8_4_ <= auVar7._8_4_) &&
              auVar11._12_4_ <= iVar10) {
            hdl->index[uVar6 + 2] = 0;
          }
          uVar6 = uVar6 + 2;
        } while (((int)sVar1 & 0x7ffe) != uVar6);
      }
    }
  }
  return;
}

Assistant:

void gai_iterator_reset(_iterator_hdl *hdl)
{
  Integer handle = GA_OFFSET + hdl->g_a;
  if (GA[handle].distr_type == REGULAR) {
    /* Regular data distribution */
    hdl->count = 0;
  } else if (GA[handle].distr_type == BLOCK_CYCLIC) {
    /* simple block cyclic data distribution */
    hdl->iproc = 0;
    hdl->iblock = 0;
    hdl->offset = 0;
  } else if (GA[handle].distr_type == SCALAPACK) {
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_proc_indices(handle, hdl->iproc, hdl->index);
  } else if (GA[handle].distr_type == TILED ||
      GA[handle].distr_type == TILED_IRREG)  {
    hdl->iproc = 0;
    hdl->offset = 0;
    /* Initialize proc_index and index arrays */
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->proc_index);
    gam_find_tile_proc_indices(handle, hdl->iproc, hdl->index);
  }
}